

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS
ref_egads_brep_pcurve
          (REF_GEOM ref_geom,REF_INT edgeid,REF_INT faceid,REF_INT degree,REF_INT n_control_point,
          REF_INT **int_bundle,REF_DBL **dbl_bundle)

{
  printf("EGADS not linked for %s\n","ref_egads_brep_pcurve");
  *int_bundle = (REF_INT *)0x0;
  *dbl_bundle = (REF_DBL *)0x0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_brep_pcurve(REF_GEOM ref_geom, REF_INT edgeid,
                                         REF_INT faceid, REF_INT degree,
                                         REF_INT n_control_point,
                                         REF_INT **int_bundle,
                                         REF_DBL **dbl_bundle) {
#if defined(HAVE_EGADS)
  ego curve, *children;
  int edgeclass, edgetype, nchild, *senses;
  double trange[2];
  REF_INT nknot;
  REF_DBL *t, *uv, *bundle;
  REF_DBL s0, s1;
  REF_DBL xyz[3];
  REF_INT i;
  REF_BOOL viz = REF_FALSE;
  REF_BOOL verbose = REF_FALSE;
  REIS(
      EGADS_SUCCESS,
      EG_getTopology(((ego *)(ref_geom->edges))[edgeid - 1], &curve, &edgeclass,
                     &edgetype, trange, &nchild, &children, &senses),
      "topo");
  SUPRESS_UNUSED_COMPILER_WARNING(faceid);
  if (verbose) printf("trange %f %f\n", trange[0], trange[1]);
  nknot = ref_geom_bspline_nknot(degree, n_control_point);
  ref_malloc(t, n_control_point, REF_DBL);
  ref_malloc(uv, 2 * n_control_point, REF_DBL);
  ref_malloc(bundle, nknot + 2 * n_control_point, REF_DBL);
  for (i = 0; i < n_control_point; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n_control_point - 1));
    s0 = 1.0 - s1;
    t[i] = s0 * trange[0] + s1 * trange[1];
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, edgeid, &(t[i]), xyz, NULL),
        "eval edge xyz");
    RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, 0, t[i], &(uv[2 * i])),
        "edge face uv");
    RSS(ref_egads_inverse_eval(ref_geom, REF_GEOM_FACE, faceid, xyz,
                               &(uv[2 * i])),
        "inv eval face uv");
    if (verbose)
      printf("t[%d] %f uv %f %f xyz %f %f %f\n", i, t[i], uv[0 + 2 * i],
             uv[1 + 2 * i], xyz[0], xyz[1], xyz[2]);
  }
  RSS(ref_geom_bspline_fit(degree, n_control_point, t, uv, bundle), "fit");
  if (viz) {
    char filename[1024];
    snprintf(filename, 1024, "pcurve-face%d-edge%d.tec", faceid, edgeid);
    RSS(ref_geom_bspline_bundle_tec(degree, n_control_point, bundle, filename),
        "tec basis");
  }
  if (NULL == int_bundle) {
  } else {
    ref_malloc(*int_bundle, 4, REF_INT);
    (*int_bundle)[0] = 0; /* bit flag */
    (*int_bundle)[1] = degree;
    (*int_bundle)[2] = n_control_point;
    (*int_bundle)[3] = nknot;
  }
  if (NULL == dbl_bundle) {
    ref_free(bundle);
  } else {
    *dbl_bundle = bundle;
  }
  ref_free(uv);
  ref_free(t);
#else
  printf("EGADS not linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(edgeid);
  SUPRESS_UNUSED_COMPILER_WARNING(faceid);
  SUPRESS_UNUSED_COMPILER_WARNING(degree);
  SUPRESS_UNUSED_COMPILER_WARNING(n_control_point);
  *int_bundle = NULL;
  *dbl_bundle = NULL;
#endif
  return REF_SUCCESS;
}